

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canonical_encoders.cc
# Opt level: O2

vector<int,_std::allocator<int>_> * __thiscall
hanabi_learning_env::CanonicalObservationEncoder::Shape
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,
          CanonicalObservationEncoder *this)

{
  int iVar1;
  int iVar2;
  HanabiGame *game;
  int iVar3;
  int iVar4;
  int iVar5;
  initializer_list<int> __l;
  allocator_type local_39;
  int local_38;
  int local_34;
  
  game = this->parent_game_;
  local_38 = anon_unknown_4::HandsSectionLength(game);
  iVar3 = anon_unknown_4::BoardSectionLength(game);
  iVar1 = game->num_colors_;
  iVar2 = game->cards_per_color_;
  iVar4 = anon_unknown_4::LastActionSectionLength(game);
  if (game->observation_type_ == kMinimal) {
    iVar5 = 0;
  }
  else {
    iVar5 = anon_unknown_4::CardKnowledgeSectionLength(game);
  }
  local_34 = iVar3 + local_38 + iVar4 + iVar5 + iVar1 * iVar2;
  __l._M_len = 1;
  __l._M_array = &local_34;
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__,__l,&local_39);
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> CanonicalObservationEncoder::Shape() const {
  return {HandsSectionLength(*parent_game_) +
          BoardSectionLength(*parent_game_) +
          DiscardSectionLength(*parent_game_) +
          LastActionSectionLength(*parent_game_) +
          (parent_game_->ObservationType() == HanabiGame::kMinimal
               ? 0
               : CardKnowledgeSectionLength(*parent_game_))};
}